

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplifyLocals.cpp
# Opt level: O3

void __thiscall
wasm::SimplifyLocals<false,false,false>::runLateOptimizations(wasm::Function*)::EquivalentOptimizer
::visitLocalSet(wasm::LocalSet__(void *this,LocalSet *curr)

{
  EquivalentSets *this_00;
  Module *module;
  Drop *pDVar1;
  LocalSet *this_01;
  Expression *pEVar2;
  bool bVar3;
  Expression *pEVar4;
  Expression **ppEVar5;
  Drop *this_02;
  Expression *local_40;
  LocalSet *local_38;
  
  module = *(Module **)((long)this + 0xd0);
  pEVar2 = curr->value;
  local_38 = curr;
  do {
    pEVar4 = pEVar2;
    local_40 = pEVar4;
    ppEVar5 = Properties::getImmediateFallthroughPtr
                        (&local_40,(PassOptions *)((long)this + 0xf0),module,AllowTeeBrIf);
    this_01 = local_38;
    pEVar2 = *ppEVar5;
  } while (*ppEVar5 != pEVar4);
  this_00 = (EquivalentSets *)((long)this + 0x1b0);
  if (pEVar4->_id == LocalGetId) {
    bVar3 = EquivalentSets::check(this_00,local_38->index,*(Index *)(pEVar4 + 1));
    if (bVar3) {
      if (*(char *)((long)this + 0xe8) == '\x01') {
        bVar3 = LocalSet::isTee(this_01);
        pDVar1 = (Drop *)this_01->value;
        if (bVar3) {
          this_02 = pDVar1;
          if ((pDVar1->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type.id
              != (this_01->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression.type.
                 id) {
            *(undefined1 *)((long)this + 0x1a9) = 1;
          }
        }
        else {
          this_02 = (Drop *)MixedArena::allocSpace(&module->allocator,0x18,8);
          (this_02->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression._id =
               DropId;
          (this_02->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type.id = 0
          ;
          this_02->value = (Expression *)pDVar1;
          Drop::finalize(this_02);
        }
        Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::replaceCurrent
                  ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)this,
                   (Expression *)this_02);
        *(undefined1 *)((long)this + 0x1a8) = 1;
      }
    }
    else {
      EquivalentSets::reset(this_00,this_01->index);
      EquivalentSets::add(this_00,this_01->index,*(Index *)(pEVar4 + 1));
    }
  }
  else {
    EquivalentSets::reset(this_00,local_38->index);
  }
  return;
}

Assistant:

void visitLocalSet(LocalSet* curr) {
        auto* module = this->getModule();

        // Remove trivial copies, even through a tee
        auto* value =
          Properties::getFallthrough(curr->value, passOptions, *module);
        if (auto* get = value->template dynCast<LocalGet>()) {
          if (equivalences.check(curr->index, get->index)) {
            // This is an unnecessary copy!
            if (removeEquivalentSets) {
              if (curr->isTee()) {
                if (curr->value->type != curr->type) {
                  refinalize = true;
                }
                this->replaceCurrent(curr->value);
              } else {
                this->replaceCurrent(Builder(*module).makeDrop(curr->value));
              }
              anotherCycle = true;
            }
            // Nothing more to do, ignore the copy.
            return;
          } else {
            // There is a new equivalence now. Remove all the old ones, and add
            // the new one.
            equivalences.reset(curr->index);
            equivalences.add(curr->index, get->index);
            return;
          }
        }
        // A new value of some kind is assigned here, and it's not something we
        // could handle earlier, so remove all the old equivalent ones.
        equivalences.reset(curr->index);
      }